

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall
kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper(BufferedOutputStreamWrapper *this)

{
  Type local_18;
  BufferedOutputStreamWrapper *local_10;
  BufferedOutputStreamWrapper *this_local;
  
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__BufferedOutputStreamWrapper_002bb698;
  local_18.this = this;
  local_10 = this;
  UnwindDetector::
  catchExceptionsIfUnwinding<kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper()::__0>
            (&this->unwindDetector,&local_18);
  Array<unsigned_char>::~Array(&this->ownedBuffer);
  BufferedOutputStream::~BufferedOutputStream(&this->super_BufferedOutputStream);
  return;
}

Assistant:

BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper() noexcept(false) {
  unwindDetector.catchExceptionsIfUnwinding([&]() {
    flush();
  });
}